

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

void udiv_urem_bv(BtorSimBitVector *a,BtorSimBitVector *b,BtorSimBitVector **q,BtorSimBitVector **r)

{
  bool bVar1;
  uint32_t uVar2;
  BtorSimBitVector *b_00;
  BtorSimBitVector *pBVar3;
  ulong uVar4;
  BtorSimBitVector *b_01;
  uint uVar5;
  ulong value;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint32_t j;
  uint uVar9;
  BtorSimBitVector *local_58;
  
  if (a->width < 0x41) {
    uVar5 = a->len;
    uVar4 = (ulong)uVar5;
    if (uVar4 == 0) {
      value = 0;
    }
    else {
      lVar6 = 0;
      value = 0;
      do {
        uVar5 = uVar5 - 1;
        value = value | (ulong)*(uint *)((long)&a[1].width + lVar6) << ((char)uVar5 * ' ' & 0x3fU);
        lVar6 = lVar6 + 4;
      } while (uVar4 << 2 != lVar6);
    }
    uVar5 = b->len;
    uVar4 = (ulong)uVar5;
    if (uVar4 == 0) {
      uVar7 = 0;
    }
    else {
      lVar6 = 0;
      uVar7 = 0;
      do {
        uVar5 = uVar5 - 1;
        uVar7 = uVar7 | (ulong)*(uint *)((long)&b[1].width + lVar6) << ((char)uVar5 * ' ' & 0x3fU);
        lVar6 = lVar6 + 4;
      } while (uVar4 << 2 != lVar6);
    }
    if (uVar7 == 0) {
      uVar4 = 0xffffffffffffffff;
    }
    else {
      uVar4 = value / uVar7;
      value = value % uVar7;
    }
    local_58 = btorsim_bv_uint64_to_bv(uVar4,a->width);
    b_01 = btorsim_bv_uint64_to_bv(value,a->width);
  }
  else {
    b_00 = btorsim_bv_neg(b);
    local_58 = btorsim_bv_new(a->width);
    pBVar3 = btorsim_bv_new(a->width);
    uVar4 = (ulong)(a->width - 1);
    do {
      b_01 = sll_bv(pBVar3,1);
      free(pBVar3);
      uVar9 = (uint)uVar4 & 0x1f;
      uVar8 = ~((uint)(uVar4 >> 5) & 0x7ffffff);
      uVar5 = b_01->len - 1;
      (&b_01[1].width)[uVar5] =
           (uint)(((&a[1].width)[a->len + uVar8] >> uVar9 & 1) != 0) |
           (&b_01[1].width)[uVar5] & 0xfffffffe;
      pBVar3 = btorsim_bv_ult(b,b_01);
      if (pBVar3->width == 1) {
        uVar2 = (&pBVar3[1].width)[pBVar3->len - 1];
        free(pBVar3);
        if ((uVar2 & 1) == 0) goto LAB_00115114;
LAB_00115141:
        pBVar3 = btorsim_bv_add(b_01,b_00);
        free(b_01);
        (&local_58[1].width)[uVar8 + local_58->len] =
             (&local_58[1].width)[uVar8 + local_58->len] | 1 << (sbyte)uVar9;
        b_01 = pBVar3;
      }
      else {
        free(pBVar3);
LAB_00115114:
        pBVar3 = btorsim_bv_eq(b,b_01);
        if (pBVar3->width == 1) {
          uVar2 = (&pBVar3[1].width)[pBVar3->len - 1];
          free(pBVar3);
          if ((uVar2 & 1) != 0) goto LAB_00115141;
        }
        else {
          free(pBVar3);
        }
      }
      bVar1 = 0 < (long)uVar4;
      pBVar3 = b_01;
      uVar4 = uVar4 - 1;
    } while (bVar1);
    free(b_00);
  }
  if (q == (BtorSimBitVector **)0x0) {
    free(local_58);
  }
  else {
    *q = local_58;
  }
  if (r == (BtorSimBitVector **)0x0) {
    free(b_01);
    return;
  }
  *r = b_01;
  return;
}

Assistant:

static void
udiv_urem_bv (const BtorSimBitVector *a,
              const BtorSimBitVector *b,
              BtorSimBitVector **q,
              BtorSimBitVector **r)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  int64_t i;
  bool is_true;
  uint64_t x, y, z;

  BtorSimBitVector *neg_b, *quot, *rem, *ult, *eq, *tmp;

  if (a->width <= 64)
  {
    x = btorsim_bv_to_uint64 (a);
    y = btorsim_bv_to_uint64 (b);
    if (y == 0)
    {
      y = x;
      x = UINT64_MAX;
    }
    else
    {
      z = x / y;
      y = x % y;
      x = z;
    }
    quot = btorsim_bv_uint64_to_bv (x, a->width);
    rem  = btorsim_bv_uint64_to_bv (y, a->width);
  }
  else
  {
    neg_b = btorsim_bv_neg (b);
    quot  = btorsim_bv_new (a->width);
    rem   = btorsim_bv_new (a->width);

    for (i = a->width - 1; i >= 0; i--)
    {
      tmp = sll_bv (rem, 1);
      free (rem);
      rem = tmp;
      btorsim_bv_set_bit (rem, 0, btorsim_bv_get_bit (a, i));

      ult     = btorsim_bv_ult (b, rem);
      is_true = btorsim_bv_is_true (ult);
      free (ult);

      if (is_true) goto UDIV_UREM_SUBTRACT;

      eq      = btorsim_bv_eq (b, rem);
      is_true = btorsim_bv_is_true (eq);
      free (eq);

      if (is_true)
      {
      UDIV_UREM_SUBTRACT:
        tmp = btorsim_bv_add (rem, neg_b);
        free (rem);
        rem = tmp;
        btorsim_bv_set_bit (quot, i, 1);
      }
    }
    free (neg_b);
  }

  if (q)
    *q = quot;
  else
    free (quot);

  if (r)
    *r = rem;
  else
    free (rem);
}